

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::setRowCount(QTableModel *this,int rows)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  int *piVar4;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int rc;
  undefined1 local_50 [28];
  int local_34;
  undefined1 local_30 [28];
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ESI;
  qVar3 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 6));
  local_10 = (int)qVar3;
  if ((-1 < local_c) && (local_10 != local_c)) {
    if (local_10 < local_c) {
      local_14 = 0;
      piVar4 = qMax<int>(&local_10,&local_14);
      iVar1 = *piVar4;
      iVar2 = local_c - local_10;
      QModelIndex::QModelIndex((QModelIndex *)0x8d5ad9);
      (**(code **)(*in_RDI + 0xf8))(in_RDI,iVar1,iVar2,local_30);
    }
    else {
      local_34 = 0;
      piVar4 = qMax<int>(&local_c,&local_34);
      iVar1 = *piVar4;
      iVar2 = local_10 - local_c;
      QModelIndex::QModelIndex((QModelIndex *)0x8d5b29);
      (**(code **)(*in_RDI + 0x108))(in_RDI,iVar1,iVar2,local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::setRowCount(int rows)
{
    int rc = verticalHeaderItems.size();
    if (rows < 0 || rc == rows)
        return;
    if (rc < rows)
        insertRows(qMax(rc, 0), rows - rc);
    else
        removeRows(qMax(rows, 0), rc - rows);
}